

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::csharp::WriteDocCommentBodyImpl
               (Printer *printer,SourceLocation *location)

{
  bool bVar1;
  ulong uVar2;
  reference pbVar3;
  char *pcVar4;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  string *local_1c0;
  string_view local_1a8;
  string_view local_198;
  string_view local_188;
  undefined1 local_178 [8];
  string line;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  iterator it;
  undefined1 auStack_140 [7];
  bool last_was_empty;
  ConvertibleToStringView local_128;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  string local_60;
  undefined4 local_3c;
  undefined1 local_38 [8];
  string comments;
  SourceLocation *location_local;
  Printer *printer_local;
  
  comments.field_2._8_8_ = location;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_1c0 = (string *)&location->leading_comments;
  }
  else {
    local_1c0 = (string *)&location->trailing_comments;
  }
  std::__cxx11::string::string((string *)local_38,local_1c0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_70 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[6],_true>
              (&local_c0,(char (*) [2])0x212f7d9,(char (*) [6])"&amp;");
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[5],_true>
              (&local_a0,(char (*) [2])0x213696e,(char (*) [5])"&lt;");
    local_80 = &local_c0;
    local_78 = 2;
    s._M_str = (char *)local_80;
    s._M_len = local_70._8_8_;
    replacements._M_len = in_R9;
    replacements._M_array = (iterator)0x2;
    absl::lts_20250127::StrReplaceAll_abi_cxx11_
              (&local_60,(lts_20250127 *)local_70._0_8_,s,replacements);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8);
    absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
              (&local_128,(string *)local_38);
    absl::lts_20250127::StrSplit<char,absl::lts_20250127::AllowEmpty>
              (&local_118,(lts_20250127 *)local_128.value_._M_len,local_128.value_._M_str,10);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              (&local_100,&local_118);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8,&local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_140,"/// <summary>\n");
    protobuf::io::Printer::Print<>(printer,_auStack_140);
    it._M_current._7_1_ = 0;
    local_150._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8);
    while( true ) {
      line.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e8);
      bVar1 = __gnu_cxx::operator!=
                        (&local_150,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&line.field_2 + 8));
      if (!bVar1) break;
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_150);
      std::__cxx11::string::string((string *)local_178,(string *)pbVar3);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        if ((it._M_current._7_1_ & 1) != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_188,"///\n");
          protobuf::io::Printer::Print<>(printer,local_188);
        }
        it._M_current._7_1_ = 0;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_178);
        if (*pcVar4 == '/') {
          std::__cxx11::string::replace((ulong)local_178,0,(char *)0x1);
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_198,"///$line$\n");
        protobuf::io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,local_198,(char (*) [5])0x1defc5b,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
      }
      else {
        it._M_current._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_178);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_150);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a8,"/// </summary>\n");
    protobuf::io::Printer::Print<>(printer,local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
    local_3c = 0;
  }
  else {
    local_3c = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void WriteDocCommentBodyImpl(io::Printer* printer, SourceLocation location) {
  std::string comments = location.leading_comments.empty()
                             ? location.trailing_comments
                             : location.leading_comments;
  if (comments.empty()) {
    return;
  }
  // XML escaping... no need for apostrophes etc as the whole text is going to
  // be a child node of a summary element, not part of an attribute.
  comments = absl::StrReplaceAll(comments, {{"&", "&amp;"}, {"<", "&lt;"}});
  std::vector<std::string> lines;
  lines = absl::StrSplit(comments, '\n', absl::AllowEmpty());
  // TODO: We really should work out which part to put in the summary and which
  // to put in the remarks... but that needs to be part of a bigger effort to
  // understand the markdown better anyway.
  printer->Print("/// <summary>\n");
  bool last_was_empty = false;
  // We squash multiple blank lines down to one, and remove any trailing blank
  // lines. We need to preserve the blank lines themselves, as this is relevant
  // in the markdown. Note that we can't remove leading or trailing whitespace
  // as *that's* relevant in markdown too. (We don't skip "just whitespace"
  // lines, either.)
  for (std::vector<std::string>::iterator it = lines.begin(); it != lines.end();
       ++it) {
    std::string line = *it;
    if (line.empty()) {
      last_was_empty = true;
    } else {
      if (last_was_empty) {
        printer->Print("///\n");
      }
      last_was_empty = false;
      // If the comment has an extra slash at the start then this can cause the
      // C# compiler to complain when generating the XML documentation Issue
      // https://github.com/grpc/grpc/issues/35905
      if (line[0] == '/') {
        line.replace(0, 1, "&#x2F;");
      }
      printer->Print("///$line$\n", "line", line);
    }
  }
  printer->Print("/// </summary>\n");
}